

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfoDebug.cpp
# Opt level: O1

HighsDebugStatus debugNoInfo(HighsInfo *info)

{
  _func_int *p_Var1;
  HighsInfoType HVar2;
  InfoRecord *pIVar3;
  HighsDebugStatus HVar4;
  uint uVar5;
  bool bVar6;
  ulong uVar7;
  bool bVar8;
  HighsInfo no_info;
  HighsInfo HStack_e8;
  
  HighsInfo::HighsInfo(&HStack_e8);
  HighsInfo::invalidate(&HStack_e8);
  uVar5 = (uint)((ulong)((long)(info->records).
                               super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(info->records).
                              super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar5 < 1) {
    bVar6 = false;
  }
  else {
    uVar7 = 0;
    bVar6 = false;
    do {
      pIVar3 = (info->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      HVar2 = pIVar3->type;
      if (HVar2 == kDouble) {
        p_Var1 = *pIVar3[1]._vptr_InfoRecord;
        if (NAN((double)p_Var1)) {
          printf("debugNoInfo: Index %d has %g != %g \n",p_Var1,p_Var1,uVar7 & 0xffffffff);
        }
        p_Var1 = *(info->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar7][1]._vptr_InfoRecord;
        if ((double)p_Var1 !=
            (double)*HStack_e8.records.
                     super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7][1]._vptr_InfoRecord) {
          bVar6 = true;
        }
        if (NAN((double)p_Var1) ||
            NAN((double)*HStack_e8.records.
                         super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7][1]._vptr_InfoRecord)) {
          bVar6 = true;
        }
      }
      else {
        if (HVar2 == kInt) {
          bVar8 = *(int *)(info->records).
                          super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7][1]._vptr_InfoRecord ==
                  *(int *)HStack_e8.records.
                          super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7][1]._vptr_InfoRecord;
        }
        else {
          if (HVar2 != kInt64) goto LAB_0022cc27;
          bVar8 = *(info->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar7][1]._vptr_InfoRecord ==
                  *HStack_e8.records.super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7][1]._vptr_InfoRecord;
        }
        if (!bVar8) {
          bVar6 = true;
        }
      }
LAB_0022cc27:
      uVar7 = uVar7 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar7);
  }
  HVar4 = kOk;
  if (bVar6) {
    HVar4 = kLogicalError;
  }
  if ((info->super_HighsInfoStruct).valid != HStack_e8.super_HighsInfoStruct.valid) {
    HVar4 = kLogicalError;
  }
  HighsInfo::~HighsInfo(&HStack_e8);
  return HVar4;
}

Assistant:

HighsDebugStatus debugNoInfo(const HighsInfo& info) {
  HighsInfo no_info;
  no_info.invalidate();
  bool error_found = false;
  const std::vector<InfoRecord*>& info_records = info.records;
  const std::vector<InfoRecord*>& no_info_records = no_info.records;
  HighsInt num_info = info_records.size();
  for (HighsInt index = 0; index < num_info; index++) {
    HighsInfoType type = info_records[index]->type;
    if (type == HighsInfoType::kInt64) {
      int v0 = (int)*(((InfoRecordInt64*)info_records[index])[0].value);
      int v1 = (int)*(((InfoRecordInt64*)info_records[index])[0].value);
      if (v0 != v1)
        printf("debugNoInfo: Index %" HIGHSINT_FORMAT " has %d != %d \n", index,
               v0, v1);
      error_found = (*(((InfoRecordInt64*)info_records[index])[0].value) !=
                     *(((InfoRecordInt64*)no_info_records[index])[0].value)) ||
                    error_found;
    } else if (type == HighsInfoType::kInt) {
      int v0 = (int)*(((InfoRecordInt*)info_records[index])[0].value);
      int v1 = (int)*(((InfoRecordInt*)info_records[index])[0].value);
      if (v0 != v1)
        printf("debugNoInfo: Index %" HIGHSINT_FORMAT " has %d != %d \n", index,
               v0, v1);
      error_found = (*(((InfoRecordInt*)info_records[index])[0].value) !=
                     *(((InfoRecordInt*)no_info_records[index])[0].value)) ||
                    error_found;
    } else if (type == HighsInfoType::kDouble) {
      double v0 = (double)*(((InfoRecordDouble*)info_records[index])[0].value);
      double v1 = (double)*(((InfoRecordDouble*)info_records[index])[0].value);
      if (v0 != v1)
        printf("debugNoInfo: Index %" HIGHSINT_FORMAT " has %g != %g \n", index,
               v0, v1);
      error_found = (*(((InfoRecordDouble*)info_records[index])[0].value) !=
                     *(((InfoRecordDouble*)no_info_records[index])[0].value)) ||
                    error_found;
    } else {
      assert(1 == 0);
    }
  }
  error_found = (info.valid != no_info.valid) || error_found;
  if (error_found) return HighsDebugStatus::kLogicalError;
  return HighsDebugStatus::kOk;
}